

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsCore helicsFederateGetCore(HelicsFederate fed,HelicsError *err)

{
  element_type *peVar1;
  FedObject *pFVar2;
  _Head_base<0UL,_helics::CoreObject_*,_false> _Var3;
  __single_object core;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_30;
  _Head_base<0UL,_helics::CoreObject_*,_false> local_28;
  MasterObjectHolder *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  pFVar2 = helics::getFedObject(fed,err);
  if ((pFVar2 == (FedObject *)0x0) ||
     (peVar1 = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 == (element_type *)0x0)) {
    _Var3._M_head_impl = (CoreObject *)0x0;
  }
  else {
    _Var3._M_head_impl = (CoreObject *)operator_new(0x48);
    ((_Var3._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((_Var3._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((_Var3._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var3._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((_Var3._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((_Var3._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var3._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (_Var3._M_head_impl)->index = 0;
    (_Var3._M_head_impl)->valid = 0;
    (_Var3._M_head_impl)->valid = 0x378424ec;
    ((_Var3._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (peVar1->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_30._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)_Var3._M_head_impl;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&((_Var3._M_head_impl)->coreptr).
                super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(peVar1->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    getMasterHolder();
    local_30._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         (_Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)0x0;
    local_28._M_head_impl = _Var3._M_head_impl;
    MasterObjectHolder::addCore
              (local_20,(unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                        &local_28);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_28
              );
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_30
              );
  }
  return _Var3._M_head_impl;
}

Assistant:

HelicsCore helicsFederateGetCore(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    auto core = std::make_unique<helics::CoreObject>();
    core->valid = gCoreValidationIdentifier;
    core->coreptr = fedObj->getCorePointer();
    auto* retcore = reinterpret_cast<HelicsCore>(core.get());
    getMasterHolder()->addCore(std::move(core));
    return retcore;
}